

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_databases.cpp
# Opt level: O1

void duckdb::DuckDBDatabasesFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  AttachedDatabase *this;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  long value;
  Catalog *pCVar6;
  _func_int **__n;
  idx_t iVar7;
  ulong index;
  Value db_path;
  bool local_13a;
  string local_128;
  string local_108;
  string local_e8;
  Value local_c8;
  Value local_88;
  LogicalType local_48;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  if (pGVar1[4]._vptr_GlobalTableFunctionState <
      (_func_int **)
      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) {
    __n = pGVar1[4]._vptr_GlobalTableFunctionState;
    if (__n < (_func_int **)
              ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
               (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) {
      index = 0;
      do {
        pGVar1[4]._vptr_GlobalTableFunctionState = (_func_int **)((long)__n + 1);
        pvVar5 = vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true>::operator[]
                           ((vector<std::reference_wrapper<duckdb::AttachedDatabase>,_true> *)
                            (pGVar1 + 1),(size_type)__n);
        this = pvVar5->_M_data;
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        pcVar2 = (this->super_CatalogEntry).name._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_128,pcVar2,
                   pcVar2 + (this->super_CatalogEntry).name._M_string_length);
        Value::Value(&local_c8,&local_128);
        DataChunk::SetValue(output,0,index,&local_c8);
        Value::~Value(&local_c8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        value = NumericCastImpl<long,_unsigned_long,_false>::Convert((this->super_CatalogEntry).oid)
        ;
        Value::BIGINT(&local_c8,value);
        DataChunk::SetValue(output,1,index,&local_c8);
        Value::~Value(&local_c8);
        bVar3 = AttachedDatabase::IsSystem(this);
        local_13a = true;
        if (!bVar3) {
          local_13a = AttachedDatabase::IsTemporary(this);
        }
        bVar3 = AttachedDatabase::IsReadOnly(this);
        LogicalType::LogicalType(&local_48,SQLNULL);
        Value::Value(&local_c8,&local_48);
        LogicalType::~LogicalType(&local_48);
        if (local_13a == false) {
          pCVar6 = AttachedDatabase::GetCatalog(this);
          iVar4 = (*pCVar6->_vptr_Catalog[0x15])(pCVar6);
          if ((char)iVar4 == '\0') {
            pCVar6 = AttachedDatabase::GetCatalog(this);
            (*pCVar6->_vptr_Catalog[0x16])(&local_e8,pCVar6);
            Value::Value(&local_88,&local_e8);
            Value::operator=(&local_c8,&local_88);
            Value::~Value(&local_88);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
              operator_delete(local_e8._M_dataplus._M_p);
            }
          }
        }
        DataChunk::SetValue(output,2,index,&local_c8);
        Value::Value(&local_88,&(this->super_CatalogEntry).comment);
        DataChunk::SetValue(output,3,index,&local_88);
        Value::~Value(&local_88);
        Value::MAP(&local_88,&(this->super_CatalogEntry).tags);
        DataChunk::SetValue(output,4,index,&local_88);
        Value::~Value(&local_88);
        Value::BOOLEAN(&local_88,local_13a);
        DataChunk::SetValue(output,5,index,&local_88);
        Value::~Value(&local_88);
        pCVar6 = AttachedDatabase::GetCatalog(this);
        (*pCVar6->_vptr_Catalog[6])(&local_108,pCVar6);
        Value::Value(&local_88,&local_108);
        DataChunk::SetValue(output,6,index,&local_88);
        Value::~Value(&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        Value::BOOLEAN(&local_88,bVar3);
        DataChunk::SetValue(output,7,index,&local_88);
        Value::~Value(&local_88);
        iVar7 = index + 1;
        Value::~Value(&local_c8);
        __n = pGVar1[4]._vptr_GlobalTableFunctionState;
      } while ((__n < (_func_int **)
                      ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
                       (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 3)) &&
              (bVar3 = index < 0x7ff, index = iVar7, bVar3));
    }
    else {
      iVar7 = 0;
    }
    output->count = iVar7;
  }
  return;
}

Assistant:

void DuckDBDatabasesFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<DuckDBDatabasesData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	// start returning values
	// either fill up the chunk or return all the remaining columns
	idx_t count = 0;
	while (data.offset < data.entries.size() && count < STANDARD_VECTOR_SIZE) {
		auto &entry = data.entries[data.offset++];

		auto &attached = entry.get().Cast<AttachedDatabase>();
		// return values:

		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, count, attached.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, count, Value::BIGINT(NumericCast<int64_t>(attached.oid)));
		bool is_internal = attached.IsSystem() || attached.IsTemporary();
		bool is_readonly = attached.IsReadOnly();
		// path, VARCHAR
		Value db_path;
		if (!is_internal) {
			bool in_memory = attached.GetCatalog().InMemory();
			if (!in_memory) {
				db_path = Value(attached.GetCatalog().GetDBPath());
			}
		}
		output.SetValue(col++, count, db_path);
		// comment, VARCHAR
		output.SetValue(col++, count, Value(attached.comment));
		// tags, MAP
		output.SetValue(col++, count, Value::MAP(attached.tags));
		// internal, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(is_internal));
		// type, VARCHAR
		output.SetValue(col++, count, Value(attached.GetCatalog().GetCatalogType()));
		// readonly, BOOLEAN
		output.SetValue(col++, count, Value::BOOLEAN(is_readonly));

		count++;
	}
	output.SetCardinality(count);
}